

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

long __thiscall
mkvparser::Tracks::ParseTrackEntry
          (Tracks *this,longlong track_start,longlong track_size,longlong element_start,
          longlong element_size,Track **pResult)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  unsigned_long_long uVar8;
  long lVar9;
  uchar *puVar10;
  Track *pTVar11;
  ulong uVar12;
  long lVar13;
  ulong stop;
  long unaff_R15;
  longlong pos;
  uchar b;
  longlong id;
  longlong size;
  ulong local_128;
  byte local_119;
  IMkvReader *local_118;
  VideoTrack *local_110;
  Track **local_108;
  ulong local_100;
  ulong local_f8;
  Tracks *local_f0;
  ulong local_e8;
  longlong local_e0;
  longlong local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  Info local_a8;
  
  lVar13 = -1;
  if (*pResult == (Track *)0x0) {
    local_118 = this->m_pSegment->m_pReader;
    stop = track_size + track_start;
    local_a8.codecPrivate = (uchar *)0x0;
    local_a8.codecPrivateSize = 0;
    local_a8.codecId = (char *)0x0;
    local_a8.codecNameAsUTF8 = (char *)0x0;
    local_a8.nameAsUTF8 = (char *)0x0;
    local_a8.language = (char *)0x0;
    local_a8.codecDelay = 0;
    local_a8.seekPreRoll = 0;
    local_a8.uid = 0;
    local_a8.defaultDuration = 0;
    local_a8.type = 0;
    local_a8.number = 0;
    local_a8.lacing = false;
    local_e8 = 0xffffffffffffffff;
    local_c8 = 1;
    local_d0 = 0xffffffffffffffff;
    local_f8 = 0xffffffffffffffff;
    local_b8 = 0xffffffffffffffff;
    local_100 = 0xffffffffffffffff;
    local_c0 = 0xffffffffffffffff;
    local_128 = track_start;
    local_f0 = this;
    local_e0 = element_start;
    local_d8 = element_size;
    do {
      if ((long)stop <= (long)local_128) {
        lVar13 = -2;
        if (((local_128 != stop) || (local_a8.number < 1)) ||
           (pTVar11 = GetTrackByNumber(local_f0,local_a8.number),
           local_a8.type < 1 || pTVar11 != (Track *)0x0)) break;
        local_a8.lacing = 0 < (long)local_c8;
        if (local_a8.type == 2) {
          if (-1 < (long)local_100 || (long)local_f8 < 0) break;
          local_a8.settings.start = local_f8;
          local_a8.settings.size = local_b8;
          local_110 = (VideoTrack *)0x0;
          lVar9 = AudioTrack::Parse(local_f0->m_pSegment,&local_a8,local_e0,local_d8,
                                    (AudioTrack **)&local_110);
          lVar13 = lVar9;
          if (lVar9 == 0) {
            *pResult = &local_110->super_Track;
            if (local_110 == (VideoTrack *)0x0) {
              __assert_fail("pResult",
                            "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                            ,0x175f,
                            "long mkvparser::Tracks::ParseTrackEntry(long long, long long, long long, long long, Track *&) const"
                           );
            }
            lVar13 = unaff_R15;
            if (-1 < (long)local_e8) {
              Track::ParseContentEncodingsEntry(&local_110->super_Track,local_e8,local_d0);
            }
          }
        }
        else if (local_a8.type == 1) {
          if (-1 < (long)local_f8 || (long)local_100 < 0) break;
          local_a8.settings.start = local_100;
          local_a8.settings.size = local_c0;
          local_110 = (VideoTrack *)0x0;
          lVar9 = VideoTrack::Parse(local_f0->m_pSegment,&local_a8,local_e0,local_d8,&local_110);
          lVar13 = lVar9;
          if (lVar9 == 0) {
            *pResult = &local_110->super_Track;
            if (local_110 == (VideoTrack *)0x0) {
              __assert_fail("pResult",
                            "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                            ,0x1749,
                            "long mkvparser::Tracks::ParseTrackEntry(long long, long long, long long, long long, Track *&) const"
                           );
            }
            lVar13 = unaff_R15;
            if (-1 < (long)local_e8) {
              Track::ParseContentEncodingsEntry(&local_110->super_Track,local_e8,local_d0);
            }
          }
        }
        else {
          if ((-1 < (long)(local_f8 & local_100)) ||
             ((local_a8.type == 0x21 && (-1 < (long)local_e8)))) break;
          local_a8.settings.start = 0xffffffffffffffff;
          local_a8.settings.size = 0;
          local_110 = (VideoTrack *)0x0;
          lVar9 = Track::Create(local_f0->m_pSegment,&local_a8,local_e0,local_d8,
                                (Track **)&local_110);
          lVar13 = lVar9;
          if ((lVar9 == 0) &&
             (*pResult = &local_110->super_Track, lVar13 = unaff_R15, local_110 == (VideoTrack *)0x0
             )) {
            __assert_fail("pResult",
                          "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                          ,0x177b,
                          "long mkvparser::Tracks::ParseTrackEntry(long long, long long, long long, long long, Track *&) const"
                         );
          }
        }
        if (lVar9 == 0) {
          lVar13 = 0;
        }
        break;
      }
      lVar13 = ParseElementHeader(local_118,(longlong *)&local_128,stop,(longlong *)&local_110,
                                  (longlong *)&local_b0);
      uVar4 = local_b0;
      uVar3 = local_128;
      if ((lVar13 < 0) || (lVar13 = -2, (long)local_b0 < 0)) {
        bVar2 = false;
      }
      else {
        lVar9 = local_a8.type;
        lVar7 = local_a8.number;
        uVar8 = local_a8.defaultDuration;
        if ((long)local_110 < 0x56aa) {
          if ((long)local_110 < 0xd7) {
            if (local_110 == (VideoTrack *)0x83) {
              lVar9 = UnserializeUInt(local_118,local_128,local_b0);
              lVar13 = unaff_R15;
              lVar7 = local_a8.number;
              uVar8 = local_a8.defaultDuration;
              if (0xfd < lVar9 - 1U) {
LAB_0011a6a1:
                lVar13 = -2;
                bVar2 = false;
                goto LAB_0011a74c;
              }
            }
            else {
              if (local_110 == (VideoTrack *)0x86) {
                lVar6 = UnserializeString(local_118,local_128,local_b0,&local_a8.codecId);
                goto LAB_0011a54a;
              }
              lVar13 = unaff_R15;
              if ((local_110 == (VideoTrack *)0x9c) &&
                 (local_c8 = UnserializeUInt(local_118,local_128,local_b0), lVar9 = local_a8.type,
                 lVar7 = local_a8.number, uVar8 = local_a8.defaultDuration, 1 < local_c8))
              goto LAB_0011a6a1;
            }
          }
          else if ((long)local_110 < 0xe1) {
            if (local_110 == (VideoTrack *)0xd7) {
              lVar7 = UnserializeUInt(local_118,local_128,local_b0);
              lVar13 = unaff_R15;
              lVar9 = local_a8.type;
              uVar8 = local_a8.defaultDuration;
              if (0x7e < lVar7 - 1U) goto LAB_0011a6a1;
            }
            else {
              lVar13 = unaff_R15;
              if (local_110 == (VideoTrack *)0xe0) {
                local_100 = local_128;
                local_c0 = local_b0;
              }
            }
          }
          else if (local_110 == (VideoTrack *)0xe1) {
            local_f8 = local_128;
            local_b8 = local_b0;
            lVar13 = unaff_R15;
          }
          else {
            lVar13 = unaff_R15;
            if (local_110 == (VideoTrack *)0x536e) {
              lVar6 = UnserializeString(local_118,local_128,local_b0,&local_a8.nameAsUTF8);
              goto LAB_0011a54a;
            }
          }
        }
        else if ((long)local_110 < 0x73c5) {
          if ((long)local_110 < 0x63a2) {
            if (local_110 == (VideoTrack *)0x56aa) {
              local_a8.codecDelay = UnserializeUInt(local_118,local_128,local_b0);
              lVar13 = unaff_R15;
              lVar9 = local_a8.type;
              lVar7 = local_a8.number;
              uVar8 = local_a8.defaultDuration;
            }
            else {
              lVar13 = unaff_R15;
              if (local_110 == (VideoTrack *)0x56bb) {
                local_a8.seekPreRoll = UnserializeUInt(local_118,local_128,local_b0);
                lVar9 = local_a8.type;
                lVar7 = local_a8.number;
                uVar8 = local_a8.defaultDuration;
              }
            }
          }
          else if (local_110 == (VideoTrack *)0x63a2) {
            if (local_a8.codecPrivate != (uchar *)0x0) {
              operator_delete__(local_a8.codecPrivate);
            }
            local_a8.codecPrivate = (uchar *)0x0;
            local_a8.codecPrivateSize = 0;
            bVar2 = true;
            if (uVar4 != 0) {
              if (uVar4 < 0x80000001) {
                local_108 = pResult;
                puVar10 = (uchar *)operator_new__(uVar4,(nothrow_t *)&std::nothrow);
              }
              else {
                puVar10 = (uchar *)0x0;
                local_108 = pResult;
              }
              if (puVar10 == (uchar *)0x0) {
                unaff_R15 = -1;
              }
              else {
                iVar5 = (**local_118->_vptr_IMkvReader)(local_118,uVar3,uVar4,puVar10);
                if (iVar5 == 0) {
                  local_a8.codecPrivateSize = uVar4;
                  bVar2 = true;
                  pResult = local_108;
                  local_a8.codecPrivate = puVar10;
                  goto LAB_0011a726;
                }
                operator_delete__(puVar10);
                unaff_R15 = (long)iVar5;
              }
              bVar2 = false;
              pResult = local_108;
            }
LAB_0011a726:
            lVar13 = unaff_R15;
            lVar6 = unaff_R15;
            lVar9 = local_a8.type;
            lVar7 = local_a8.number;
            uVar8 = local_a8.defaultDuration;
            if (!bVar2) {
LAB_0011a557:
              lVar13 = lVar6;
              bVar2 = false;
              goto LAB_0011a74c;
            }
          }
          else {
            lVar13 = unaff_R15;
            if (local_110 == (VideoTrack *)0x6d80) {
              local_e8 = local_128;
              local_d0 = local_b0;
            }
          }
        }
        else if ((long)local_110 < 0x23e383) {
          if (local_110 == (VideoTrack *)0x73c5) {
            if (8 < (long)local_b0) goto LAB_0011a6a1;
            local_a8.uid = 0;
            uVar1 = local_b0 + local_128;
            local_108 = pResult;
            for (uVar12 = local_128; lVar13 = unaff_R15, uVar12 != uVar1; uVar12 = uVar12 + 1) {
              iVar5 = (**local_118->_vptr_IMkvReader)(local_118,uVar12,1,&local_119);
              if (iVar5 != 0) {
                lVar13 = (long)iVar5;
                break;
              }
              local_a8.uid = (ulong)local_119 | local_a8.uid << 8;
            }
            pResult = local_108;
            lVar9 = local_a8.type;
            lVar7 = local_a8.number;
            uVar8 = local_a8.defaultDuration;
            if (uVar12 != uVar1) {
              bVar2 = false;
              goto LAB_0011a74c;
            }
          }
          else {
            lVar13 = unaff_R15;
            if (local_110 == (VideoTrack *)0x22b59c) {
              lVar6 = UnserializeString(local_118,local_128,local_b0,&local_a8.language);
LAB_0011a54a:
              lVar13 = unaff_R15;
              lVar9 = local_a8.type;
              lVar7 = local_a8.number;
              uVar8 = local_a8.defaultDuration;
              if (lVar6 != 0) goto LAB_0011a557;
            }
          }
        }
        else if (local_110 == (VideoTrack *)0x23e383) {
          uVar8 = UnserializeUInt(local_118,local_128,local_b0);
          lVar13 = unaff_R15;
          lVar9 = local_a8.type;
          lVar7 = local_a8.number;
          if ((long)uVar8 < 0) {
            lVar6 = -2;
            goto LAB_0011a557;
          }
        }
        else {
          lVar13 = unaff_R15;
          if (local_110 == (VideoTrack *)0x258688) {
            lVar6 = UnserializeString(local_118,local_128,local_b0,&local_a8.codecNameAsUTF8);
            goto LAB_0011a54a;
          }
        }
        local_a8.defaultDuration = uVar8;
        local_a8.number = lVar7;
        local_a8.type = lVar9;
        local_128 = uVar3 + uVar4;
        bVar2 = (long)local_128 <= (long)stop;
        if ((long)stop < (long)local_128) {
          lVar13 = -2;
        }
      }
LAB_0011a74c:
      unaff_R15 = lVar13;
    } while (bVar2);
    Track::Info::Clear(&local_a8);
  }
  return lVar13;
}

Assistant:

long Tracks::ParseTrackEntry(long long track_start, long long track_size,
                             long long element_start, long long element_size,
                             Track*& pResult) const {
  if (pResult)
    return -1;

  IMkvReader* const pReader = m_pSegment->m_pReader;

  long long pos = track_start;
  const long long track_stop = track_start + track_size;

  Track::Info info;

  info.type = 0;
  info.number = 0;
  info.uid = 0;
  info.defaultDuration = 0;

  Track::Settings v;
  v.start = -1;
  v.size = -1;

  Track::Settings a;
  a.start = -1;
  a.size = -1;

  Track::Settings e;  // content_encodings_settings;
  e.start = -1;
  e.size = -1;

  long long lacing = 1;  // default is true

  while (pos < track_stop) {
    long long id, size;

    const long status = ParseElementHeader(pReader, pos, track_stop, id, size);

    if (status < 0)  // error
      return status;

    if (size < 0)
      return E_FILE_FORMAT_INVALID;

    const long long start = pos;

    if (id == libwebm::kMkvVideo) {
      v.start = start;
      v.size = size;
    } else if (id == libwebm::kMkvAudio) {
      a.start = start;
      a.size = size;
    } else if (id == libwebm::kMkvContentEncodings) {
      e.start = start;
      e.size = size;
    } else if (id == libwebm::kMkvTrackUID) {
      if (size > 8)
        return E_FILE_FORMAT_INVALID;

      info.uid = 0;

      long long pos_ = start;
      const long long pos_end = start + size;

      while (pos_ != pos_end) {
        unsigned char b;

        const int status = pReader->Read(pos_, 1, &b);

        if (status)
          return status;

        info.uid <<= 8;
        info.uid |= b;

        ++pos_;
      }
    } else if (id == libwebm::kMkvTrackNumber) {
      const long long num = UnserializeUInt(pReader, pos, size);

      if ((num <= 0) || (num > 127))
        return E_FILE_FORMAT_INVALID;

      info.number = static_cast<long>(num);
    } else if (id == libwebm::kMkvTrackType) {
      const long long type = UnserializeUInt(pReader, pos, size);

      if ((type <= 0) || (type > 254))
        return E_FILE_FORMAT_INVALID;

      info.type = static_cast<long>(type);
    } else if (id == libwebm::kMkvName) {
      const long status =
          UnserializeString(pReader, pos, size, info.nameAsUTF8);

      if (status)
        return status;
    } else if (id == libwebm::kMkvLanguage) {
      const long status = UnserializeString(pReader, pos, size, info.language);

      if (status)
        return status;
    } else if (id == libwebm::kMkvDefaultDuration) {
      const long long duration = UnserializeUInt(pReader, pos, size);

      if (duration < 0)
        return E_FILE_FORMAT_INVALID;

      info.defaultDuration = static_cast<unsigned long long>(duration);
    } else if (id == libwebm::kMkvCodecID) {
      const long status = UnserializeString(pReader, pos, size, info.codecId);

      if (status)
        return status;
    } else if (id == libwebm::kMkvFlagLacing) {
      lacing = UnserializeUInt(pReader, pos, size);

      if ((lacing < 0) || (lacing > 1))
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvCodecPrivate) {
      delete[] info.codecPrivate;
      info.codecPrivate = NULL;
      info.codecPrivateSize = 0;

      const size_t buflen = static_cast<size_t>(size);

      if (buflen) {
        unsigned char* buf = SafeArrayAlloc<unsigned char>(1, buflen);

        if (buf == NULL)
          return -1;

        const int status = pReader->Read(pos, static_cast<long>(buflen), buf);

        if (status) {
          delete[] buf;
          return status;
        }

        info.codecPrivate = buf;
        info.codecPrivateSize = buflen;
      }
    } else if (id == libwebm::kMkvCodecName) {
      const long status =
          UnserializeString(pReader, pos, size, info.codecNameAsUTF8);

      if (status)
        return status;
    } else if (id == libwebm::kMkvCodecDelay) {
      info.codecDelay = UnserializeUInt(pReader, pos, size);
    } else if (id == libwebm::kMkvSeekPreRoll) {
      info.seekPreRoll = UnserializeUInt(pReader, pos, size);
    }

    pos += size;  // consume payload
    if (pos > track_stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != track_stop)
    return E_FILE_FORMAT_INVALID;

  if (info.number <= 0)  // not specified
    return E_FILE_FORMAT_INVALID;

  if (GetTrackByNumber(info.number))
    return E_FILE_FORMAT_INVALID;

  if (info.type <= 0)  // not specified
    return E_FILE_FORMAT_INVALID;

  info.lacing = (lacing > 0) ? true : false;

  if (info.type == Track::kVideo) {
    if (v.start < 0)
      return E_FILE_FORMAT_INVALID;

    if (a.start >= 0)
      return E_FILE_FORMAT_INVALID;

    info.settings = v;

    VideoTrack* pTrack = NULL;

    const long status = VideoTrack::Parse(m_pSegment, info, element_start,
                                          element_size, pTrack);

    if (status)
      return status;

    pResult = pTrack;
    assert(pResult);

    if (e.start >= 0)
      pResult->ParseContentEncodingsEntry(e.start, e.size);
  } else if (info.type == Track::kAudio) {
    if (a.start < 0)
      return E_FILE_FORMAT_INVALID;

    if (v.start >= 0)
      return E_FILE_FORMAT_INVALID;

    info.settings = a;

    AudioTrack* pTrack = NULL;

    const long status = AudioTrack::Parse(m_pSegment, info, element_start,
                                          element_size, pTrack);

    if (status)
      return status;

    pResult = pTrack;
    assert(pResult);

    if (e.start >= 0)
      pResult->ParseContentEncodingsEntry(e.start, e.size);
  } else {
    // neither video nor audio - probably metadata or subtitles

    if (a.start >= 0)
      return E_FILE_FORMAT_INVALID;

    if (v.start >= 0)
      return E_FILE_FORMAT_INVALID;

    if (info.type == Track::kMetadata && e.start >= 0)
      return E_FILE_FORMAT_INVALID;

    info.settings.start = -1;
    info.settings.size = 0;

    Track* pTrack = NULL;

    const long status =
        Track::Create(m_pSegment, info, element_start, element_size, pTrack);

    if (status)
      return status;

    pResult = pTrack;
    assert(pResult);
  }

  return 0;  // success
}